

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  bool bVar2;
  SurfaceMesh *pSVar3;
  size_t sVar4;
  pointer puVar5;
  ulong uVar6;
  Vector2 *pVVar7;
  long lVar8;
  size_t sVar9;
  runtime_error *this_00;
  size_t i;
  ulong uVar10;
  size_t sVar11;
  size_t i_1;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double local_80;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> local_70;
  
  if (((this->super_BaseGeometryInterface).mesh)->useImplicitTwinFlag == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh"
              );
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) goto LAB_0018711c;
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  if ((this->cornerScaledAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_0018711c:
      ::std::__throw_bad_function_call();
    }
    (*(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->cornerScaledAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator=
            (&this->halfedgeVectorsInVertex,&local_70);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar3 = (this->super_BaseGeometryInterface).mesh;
  sVar4 = pSVar3->nVerticesFillCount;
  if ((sVar4 == 0) ||
     (puVar5 = (pSVar3->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar5 != 0xffffffffffffffff)) {
    sVar9 = 0;
  }
  else {
    sVar11 = 0;
    do {
      sVar9 = sVar4;
      if (sVar4 - 1 == sVar11) break;
      sVar9 = sVar11 + 1;
      lVar8 = sVar11 + 1;
      sVar11 = sVar9;
    } while (puVar5[lVar8] == 0xffffffffffffffff);
  }
  if (sVar9 != sVar4) {
    do {
      uVar6 = (pSVar3->vHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar9];
      local_80 = 0.0;
      uVar12 = uVar6;
      do {
        dVar13 = cos(local_80);
        dVar14 = sin(local_80);
        bVar2 = pSVar3->useImplicitTwinFlag;
        if (bVar2 == true) {
          uVar10 = uVar12 >> 1;
        }
        else {
          uVar10 = (pSVar3->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
        }
        dVar1 = (this->edgeLengths).data.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar10];
        pVVar7 = (this->halfedgeVectorsInVertex).data.
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pVVar7[uVar12].x = dVar1 * dVar13;
        pVVar7[uVar12].y = dVar14 * dVar1;
        sVar11 = sVar9;
        if (pSVar3->nFacesFillCount <=
            (pSVar3->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12]) break;
        puVar5 = (pSVar3->heNextArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = puVar5[puVar5[uVar12]];
        if (bVar2 == false) {
          uVar10 = (pSVar3->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        }
        else {
          uVar10 = uVar10 ^ 1;
        }
        local_80 = local_80 +
                   (this->cornerScaledAngles).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar12];
        uVar12 = uVar10;
      } while (uVar10 != uVar6);
      do {
        sVar9 = sVar4;
        if (sVar4 - 1 == sVar11) break;
        sVar9 = sVar11 + 1;
        lVar8 = sVar11 + 1;
        sVar11 = sVar9;
      } while ((pSVar3->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == 0xffffffffffffffff);
    } while (sVar9 != sVar4);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex() {

  if (!mesh.usesImplicitTwin()) {
    throw std::runtime_error("ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh");
  }

  edgeLengthsQ.ensureHave();
  cornerScaledAnglesQ.ensureHave();

  halfedgeVectorsInVertex = HalfedgeData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    double coordSum = 0.0;

    // Custom loop to orbit CCW
    Halfedge firstHe = v.halfedge();
    Halfedge currHe = firstHe;
    do {
      halfedgeVectorsInVertex[currHe] = Vector2::fromAngle(coordSum) * edgeLengths[currHe.edge()];
      coordSum += cornerScaledAngles[currHe.corner()];
      if (!currHe.isInterior()) break;
      currHe = currHe.next().next().twin();
    } while (currHe != firstHe);
  }
}